

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::testRunEnded(ConsoleReporter *this,TestRunStats *_testRunStats)

{
  ostream *this_00;
  TestRunStats *in_RSI;
  StreamingReporterBase *in_RDI;
  Totals *in_stack_00000258;
  ConsoleReporter *in_stack_00000260;
  Totals *in_stack_000003b0;
  ColourImpl *in_stack_000003b8;
  ostream *in_stack_000003c0;
  
  printTotalsDivider(in_stack_00000260,in_stack_00000258);
  Detail::unique_ptr<Catch::ColourImpl>::operator*(&(in_RDI->super_ReporterBase).m_colour);
  printTestRunTotals(in_stack_000003c0,in_stack_000003b8,in_stack_000003b0);
  this_00 = std::operator<<((in_RDI->super_ReporterBase).m_stream,'\n');
  std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
  StreamingReporterBase::testRunEnded(in_RDI,in_RSI);
  return;
}

Assistant:

void ConsoleReporter::testRunEnded(TestRunStats const& _testRunStats) {
    printTotalsDivider(_testRunStats.totals);
    printTestRunTotals( m_stream, *m_colour, _testRunStats.totals );
    m_stream << '\n' << std::flush;
    StreamingReporterBase::testRunEnded(_testRunStats);
}